

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::RoaringScanState::Skip
          (RoaringScanState *this,ContainerScanState *scan_state,idx_t skip_count)

{
  idx_t iVar1;
  
  iVar1 = scan_state->scanned_count + skip_count;
  if (iVar1 == scan_state->container_size) {
    scan_state->scanned_count = iVar1;
    return;
  }
  (*scan_state->_vptr_ContainerScanState[3])(scan_state,skip_count);
  return;
}

Assistant:

void RoaringScanState::Skip(ContainerScanState &scan_state, idx_t skip_count) {
	D_ASSERT(scan_state.scanned_count + skip_count <= scan_state.container_size);
	if (scan_state.scanned_count + skip_count == scan_state.container_size) {
		scan_state.scanned_count = scan_state.container_size;
		// This skips all remaining values covered by this container
		return;
	}
	scan_state.Skip(skip_count);
}